

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

QString * QBenchmarkValgrindUtils::getNewestFileName(void)

{
  bool bVar1;
  enum_type eVar2;
  QFileInfo *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  int suffix;
  QFileInfo *fileInfo;
  QFileInfoList *__range1;
  int hiSuffix;
  bool ok;
  QRegularExpressionMatch match;
  const_iterator __end1;
  const_iterator __begin1;
  QRegularExpression rx;
  QString pattern;
  QFileInfo lastFileInfo;
  QFileInfoList fiList;
  QString base;
  QStringList nameFilters;
  undefined4 in_stack_fffffffffffffdf8;
  MatchOption in_stack_fffffffffffffdfc;
  enum_type in_stack_fffffffffffffe00;
  enum_type in_stack_fffffffffffffe04;
  undefined4 uVar6;
  char (*in_stack_fffffffffffffe08) [9];
  QFileInfo *this;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  QString *in_stack_fffffffffffffe18;
  QString *a;
  QString *this_00;
  undefined8 in_stack_fffffffffffffe48;
  QChar fillChar;
  enum_type local_1ac;
  undefined1 local_190 [27];
  undefined1 local_175;
  undefined4 local_174;
  undefined1 local_170 [24];
  undefined1 *local_158;
  QFileInfo *local_150;
  const_iterator local_148;
  const_iterator local_140;
  uint local_134;
  undefined1 *local_130;
  QChar local_122;
  storage_type *local_120;
  undefined1 local_110 [24];
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *local_d8 [2];
  QString local_c8;
  QDir local_b0 [8];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QChar local_8a;
  storage_type *local_88;
  undefined1 local_78 [48];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffe48 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x1ad9e1);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QByteArrayView::QByteArrayView<5ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (char (*) [5])in_stack_fffffffffffffe08);
  QVar4.m_data = local_88;
  QVar4.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar4);
  QChar::QChar<char16_t,_true>(&local_8a,L' ');
  QString::arg<QString,_true>(this_00,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,fillChar);
  QList<QString>::operator<<
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (rvalue_ref)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QString::~QString((QString *)0x1adaab);
  QString::~QString((QString *)0x1adab8);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  a = &local_c8;
  QString::QString((QString *)0x1adaeb);
  QDir::QDir(local_b0,(QString *)a);
  operator|(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
  QFlags<QDir::SortFlag>::QFlags
            ((QFlags<QDir::SortFlag> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
             ,in_stack_fffffffffffffdfc);
  QDir::entryInfoList((QList_conflict *)&local_a8,(QFlags_conflict *)local_b0,
                      (QFlags_conflict *)&local_28);
  QDir::~QDir(local_b0);
  QString::~QString((QString *)0x1adb69);
  local_1ac = NoFilter;
  local_d8[0] = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)local_d8);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArrayView::QByteArrayView<9ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  QVar5.m_data = local_120;
  QVar5.m_size = (qsizetype)local_110;
  QString::fromLatin1(QVar5);
  QChar::QChar<char16_t,_true>(&local_122,L' ');
  QString::arg<QString,_true>(this_00,a,in_stack_fffffffffffffe14,fillChar);
  QString::~QString((QString *)0x1adc2f);
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_stack_fffffffffffffdfc
            );
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)&local_130,(QString *)&local_f8,
             (QFlags_conflict *)(ulong)local_134);
  local_140.i = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_140 = QList<QFileInfo>::begin
                        ((QList<QFileInfo> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_148.i = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_148 = QList<QFileInfo>::end
                        ((QList<QFileInfo> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  while( true ) {
    local_150 = local_148.i;
    bVar1 = QList<QFileInfo>::const_iterator::operator!=(&local_140,local_148);
    if (!bVar1) break;
    pQVar3 = QList<QFileInfo>::const_iterator::operator*(&local_140);
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    this = pQVar3;
    QFileInfo::fileName();
    uVar6 = 0;
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)(ulong)(uint)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc);
    QRegularExpression::match(&local_158,&local_130,local_170,uVar6,uVar6,local_174);
    QString::~QString((QString *)0x1adda6);
    local_175 = 0xaa;
    QRegularExpressionMatch::captured((int)local_190);
    eVar2 = QString::toInt((QString *)this,(bool *)CONCAT44(uVar6,in_stack_fffffffffffffe00),
                           in_stack_fffffffffffffdfc);
    QString::~QString((QString *)0x1addee);
    in_stack_fffffffffffffe00 = eVar2;
    if (local_1ac < eVar2) {
      QFileInfo::operator=((QFileInfo *)local_d8,pQVar3);
      local_1ac = eVar2;
    }
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_158);
    QList<QFileInfo>::const_iterator::operator++(&local_140);
  }
  QFileInfo::fileName();
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_130);
  QString::~QString((QString *)0x1adffd);
  QFileInfo::~QFileInfo((QFileInfo *)local_d8);
  QList<QFileInfo>::~QList((QList<QFileInfo> *)0x1ae017);
  QString::~QString((QString *)0x1ae024);
  QList<QString>::~QList((QList<QString> *)0x1ae031);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QBenchmarkValgrindUtils::getNewestFileName()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());

    nameFilters << QString::fromLatin1("%1.*").arg(base);
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    Q_ASSERT(!fiList.empty());
    int hiSuffix = -1;
    QFileInfo lastFileInfo;
    const QString pattern = QString::fromLatin1("%1.(\\d+)").arg(base);
    QRegularExpression rx(pattern);
    for (const QFileInfo &fileInfo : fiList) {
        QRegularExpressionMatch match = rx.match(fileInfo.fileName());
        Q_ASSERT(match.hasMatch());
        bool ok;
        const int suffix = match.captured(1).toInt(&ok);
        Q_ASSERT(ok);
        Q_ASSERT(suffix >= 0);
        if (suffix > hiSuffix) {
            lastFileInfo = fileInfo;
            hiSuffix = suffix;
        }
    }

    return lastFileInfo.fileName();
}